

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiCutFab.cpp
# Opt level: O2

MultiFab * __thiscall
amrex::MultiCutFab::ToMultiFab
          (MultiFab *__return_storage_ptr__,MultiCutFab *this,Real regular_value,Real covered_value)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  MultiCutFab *this_00;
  int i;
  int iVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  MFIter mfi;
  Box local_184;
  MultiCutFab *local_168;
  ulong local_160;
  FabArray<amrex::FArrayBox> *local_158;
  long local_150;
  Real local_148;
  Real local_140;
  long local_138;
  long local_130;
  long local_128;
  ulong local_120;
  long local_118;
  Array4<double> local_110;
  Array4<const_double> local_d0;
  undefined1 local_90 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_80;
  int local_68;
  Vector<int,_std::allocator<int>_> *local_50;
  
  uVar7 = (this->m_data).super_FabArrayBase.n_comp;
  local_90._0_8_ =
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
  local_90._8_8_ = (FabArrayBase *)0x0;
  vStack_80.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_80.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_80.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_110.p = (double *)&PTR__FabFactory_006d8928;
  local_168 = this;
  local_148 = covered_value;
  local_140 = regular_value;
  MultiFab::MultiFab(__return_storage_ptr__,&(this->m_data).super_FabArrayBase.boxarray,
                     &(this->m_data).super_FabArrayBase.distributionMap,uVar7,
                     (this->m_data).super_FabArrayBase.n_grow.vect[0],(MFInfo *)local_90,
                     (FabFactory<amrex::FArrayBox> *)&local_110);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_80);
  MFIter::MFIter((MFIter *)local_90,(FabArrayBase *)__return_storage_ptr__,'\0');
  if ((int)uVar7 < 1) {
    uVar7 = 0;
  }
  local_160 = (ulong)uVar7;
  local_158 = &__return_storage_ptr__->super_FabArray<amrex::FArrayBox>;
  while (this_00 = local_168,
        (int)vStack_80.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage < local_68) {
    iVar3 = (int)vStack_80.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (local_50 != (Vector<int,_std::allocator<int>_> *)0x0) {
      iVar3 = (local_50->super_vector<int,_std::allocator<int>_>).
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [(int)vStack_80.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage];
    }
    iVar3 = *(int *)&((local_168->m_cellflags->m_fabs_v).
                      super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar3]->
                     super_BaseFab<amrex::EBCellFlag>).field_0x44;
    MFIter::fabbox(&local_184,(MFIter *)local_90);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_110,&__return_storage_ptr__->super_FabArray<amrex::FArrayBox>,
               (MFIter *)local_90);
    auVar2 = _DAT_00601800;
    auVar1 = _DAT_006017f0;
    if (iVar3 == 1) {
      FabArray<amrex::CutFab>::const_array<amrex::CutFab,_0>
                (&local_d0,&this_00->m_data,(MFIter *)local_90);
      local_128 = (long)local_184.smallend.vect[1];
      local_138 = (long)local_184.smallend.vect[2];
      local_130 = (long)local_184.smallend.vect[0] * 8;
      local_150 = 0;
      for (local_120 = 0; lVar6 = local_138, local_120 != local_160; local_120 = local_120 + 1) {
        for (; (int)lVar6 <= local_184.bigend.vect[2]; lVar6 = lVar6 + 1) {
          local_118 = (long)local_d0.begin.z;
          lVar9 = (long)local_110.p +
                  local_110.nstride * local_150 +
                  (local_128 - local_110.begin.y) * local_110.jstride * 8 +
                  (lVar6 - local_110.begin.z) * local_110.kstride * 8 + (long)local_110.begin.x * -8
                  + local_130;
          lVar5 = (long)local_d0.p +
                  local_d0.nstride * local_150 +
                  (local_128 - local_d0.begin.y) * local_d0.jstride * 8 +
                  (lVar6 - local_118) * local_d0.kstride * 8 + (long)local_d0.begin.x * -8 +
                  local_130;
          for (lVar10 = local_128; lVar10 <= local_184.bigend.vect[1]; lVar10 = lVar10 + 1) {
            if (local_184.smallend.vect[0] <= local_184.bigend.vect[0]) {
              lVar8 = 0;
              do {
                *(undefined8 *)(lVar9 + lVar8 * 8) = *(undefined8 *)(lVar5 + lVar8 * 8);
                lVar8 = lVar8 + 1;
              } while ((local_184.bigend.vect[0] - local_184.smallend.vect[0]) + 1 != (int)lVar8);
            }
            lVar9 = lVar9 + local_110.jstride * 8;
            lVar5 = lVar5 + local_d0.jstride * 8;
          }
          __return_storage_ptr__ = (MultiFab *)local_158;
        }
        local_150 = local_150 + 8;
      }
    }
    else {
      uVar12 = SUB84(local_140,0);
      uVar13 = (undefined4)((ulong)local_140 >> 0x20);
      if (iVar3 != 0) {
        uVar12 = SUB84(local_148,0);
        uVar13 = (undefined4)((ulong)local_148 >> 0x20);
      }
      uVar7 = local_184.bigend.vect[0] - local_184.smallend.vect[0];
      auVar14._4_4_ = 0;
      auVar14._0_4_ = uVar7;
      auVar14._8_4_ = uVar7;
      auVar14._12_4_ = 0;
      auVar14 = auVar14 ^ _DAT_00601800;
      lVar6 = 0;
      for (uVar4 = 0; lVar10 = (long)local_184.smallend.vect[2], uVar4 != local_160;
          uVar4 = uVar4 + 1) {
        for (; (int)lVar10 <= local_184.bigend.vect[2]; lVar10 = lVar10 + 1) {
          lVar9 = (long)local_110.p +
                  local_110.nstride * lVar6 +
                  (lVar10 - local_110.begin.z) * local_110.kstride * 8 +
                  ((long)local_184.smallend.vect[1] - (long)local_110.begin.y) *
                  local_110.jstride * 8 + (long)local_110.begin.x * -8 +
                  (long)local_184.smallend.vect[0] * 8 + 8;
          for (lVar5 = (long)local_184.smallend.vect[1]; lVar5 <= local_184.bigend.vect[1];
              lVar5 = lVar5 + 1) {
            if (local_184.smallend.vect[0] <= local_184.bigend.vect[0]) {
              uVar11 = 0;
              do {
                auVar15._8_4_ = (int)uVar11;
                auVar15._0_8_ = uVar11;
                auVar15._12_4_ = (int)(uVar11 >> 0x20);
                auVar15 = (auVar15 | auVar1) ^ auVar2;
                if ((bool)(~(auVar14._4_4_ < auVar15._4_4_ ||
                            auVar14._0_4_ < auVar15._0_4_ && auVar15._4_4_ == auVar14._4_4_) & 1)) {
                  *(ulong *)(lVar9 + -8 + uVar11 * 8) = CONCAT44(uVar13,uVar12);
                }
                if (auVar15._12_4_ <= auVar14._12_4_ &&
                    (auVar15._8_4_ <= auVar14._8_4_ || auVar15._12_4_ != auVar14._12_4_)) {
                  *(ulong *)(lVar9 + uVar11 * 8) = CONCAT44(uVar13,uVar12);
                }
                uVar11 = uVar11 + 2;
              } while (((ulong)uVar7 + 2 & 0xfffffffffffffffe) != uVar11);
            }
            lVar9 = lVar9 + local_110.jstride * 8;
          }
        }
        lVar6 = lVar6 + 8;
        __return_storage_ptr__ = (MultiFab *)local_158;
      }
    }
    MFIter::operator++((MFIter *)local_90);
  }
  MFIter::~MFIter((MFIter *)local_90);
  return (MultiFab *)&__return_storage_ptr__->super_FabArray<amrex::FArrayBox>;
}

Assistant:

MultiFab
MultiCutFab::ToMultiFab (Real regular_value, Real covered_value) const
{
    const int ncomp = nComp();
    MultiFab mf(boxArray(), DistributionMap(), ncomp, nGrow());
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(mf); mfi.isValid(); ++mfi)
    {
        auto t = (*m_cellflags)[mfi].getType();
        Box const& b = mfi.fabbox();
        Array4<Real> const& d = mf.array(mfi);
        if (t == FabType::singlevalued) {
            Array4<Real const> const& s = m_data.const_array(mfi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D(b, ncomp, i, j, k, n,
            {
                d(i,j,k,n) = s(i,j,k,n);
            });
        } else {
            Real val = (t == FabType::regular) ? regular_value : covered_value;
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D(b, ncomp, i, j, k, n,
            {
                d(i,j,k,n) = val;
            });
        }
    }
    return mf;
}